

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::ElementBufferTest::DrawAndCheck(ElementBufferTest *this)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  int *piVar7;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar6 + 0x1680))(this->m_po);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x463);
  (**(code **)(lVar6 + 0xd8))(this->m_vao);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x466);
  (**(code **)(lVar6 + 0x30))(0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x469);
  (**(code **)(lVar6 + 0x568))(0,3,0x1405,0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x46d);
  (**(code **)(lVar6 + 0x638))();
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x471);
  piVar7 = (int *)(**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x475);
  iVar4 = *piVar7;
  iVar1 = piVar7[1];
  iVar2 = piVar7[2];
  (**(code **)(lVar6 + 0x1670))(0x8c8e);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x47a);
  if ((iVar4 != 0) || (bVar3 = true, iVar2 != 2 || iVar1 != 1)) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Result vector is equal to [",0x1b);
    std::ostream::operator<<(this_00,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"], but [0, 1, 2] was expected.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ElementBufferTest::DrawAndCheck()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	/* Draw. */
	gl.drawElements(GL_POINTS, 3, GL_UNSIGNED_INT, NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	/* State reset. */
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	glw::GLint* result_ptr = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	glw::GLint result[3] = { result_ptr[0], result_ptr[1], result_ptr[2] };

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	/* Check result and return. */
	for (glw::GLint i = 0; i < 3; ++i)
	{
		if (i != result[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to [" << result[0]
												<< ", " << result[1] << ", " << result[2]
												<< "], but [0, 1, 2] was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}